

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

void __thiscall Liby::http::Request::print(Request *this)

{
  _Hash_node_base *p_Var1;
  Logger *pLVar2;
  double __x;
  double __x_00;
  double __x_01;
  
  pLVar2 = Logger::getLogger();
  Logger::log(pLVar2,__x);
  pLVar2 = Logger::getLogger();
  Logger::log(pLVar2,__x_00);
  for (p_Var1 = (this->headers_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    pLVar2 = Logger::getLogger();
    Logger::log(pLVar2,__x_01);
  }
  return;
}

Assistant:

void Request::print() {
    info("uri: %s", uri_.data());
    info("query: %s", query_.data());
    for (auto &x : headers_) {
        info("%s: %s", x.first.data(), x.second.data());
    }
}